

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void geopolyWithinFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  Mem *pMem;
  int iVar1;
  GeoPoly *p1;
  GeoPoly *p2;
  ulong val;
  
  p1 = geopolyFuncParam(context,*argv,(int *)0x0);
  p2 = geopolyFuncParam(context,argv[1],(int *)0x0);
  if (p2 != (GeoPoly *)0x0 && p1 != (GeoPoly *)0x0) {
    iVar1 = geopolyOverlap(p1,p2);
    if (iVar1 < 0) {
      sqlite3_result_error_nomem(context);
    }
    else {
      val = 1;
      if (iVar1 != 2) {
        val = (ulong)((uint)(iVar1 == 4) * 2);
      }
      pMem = context->pOut;
      if ((pMem->flags & 0x9000) == 0) {
        (pMem->u).i = val;
        pMem->flags = 4;
      }
      else {
        vdbeReleaseAndSetInt64(pMem,val);
      }
    }
  }
  sqlite3_free(p1);
  sqlite3_free(p2);
  return;
}

Assistant:

static void geopolyWithinFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  GeoPoly *p1 = geopolyFuncParam(context, argv[0], 0);
  GeoPoly *p2 = geopolyFuncParam(context, argv[1], 0);
  (void)argc;
  if( p1 && p2 ){
    int x = geopolyOverlap(p1, p2);
    if( x<0 ){
      sqlite3_result_error_nomem(context);
    }else{
      sqlite3_result_int(context, x==2 ? 1 : x==4 ? 2 : 0);
    }
  }
  sqlite3_free(p1);
  sqlite3_free(p2);
}